

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  Validator *pVVar4;
  char *pcVar5;
  ListElementCount LVar6;
  ListElementCount LVar7;
  bool *__s;
  bool *__s_00;
  ulong uVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  uint64_t id;
  size_t count;
  ArrayPtr<unsigned_short> AVar12;
  StringPtr name;
  bool _kjCondition_7;
  bool fieldIsPointer;
  Validator *local_278;
  uint nonDiscriminantPos;
  uint dataSizeInBits;
  Reader *local_268;
  uint local_25c;
  uint nextOrdinal;
  uint discriminantPos;
  uint fieldBits;
  uint pointerCount;
  Fault f;
  ArrayDisposer *local_238;
  uint local_228;
  DebugComparison<unsigned_short,_int> _kjCondition;
  Fault f_3;
  uint64_t scopeId_local;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  uint local_128;
  anon_class_8_1_a7e8901a _kjContextFunc341;
  IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
  local_118;
  bool _kjCondition_3;
  Reader fields;
  Reader local_a8;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  
  uVar1 = (structNode->_reader).dataSize;
  if (uVar1 < 0x80) {
    dataSizeInBits = 0;
    pointerCount = 0;
  }
  else {
    dataSizeInBits = (uint)*(ushort *)((long)(structNode->_reader).data + 0xe) << 6;
    pointerCount = 0;
    if (0xcf < uVar1) {
      pointerCount = (uint)*(ushort *)((long)(structNode->_reader).data + 0x18);
    }
  }
  local_278 = this;
  local_268 = structNode;
  scopeId_local = scopeId;
  capnp::schema::Node::Struct::Reader::getFields(&fields,structNode);
  LVar6 = fields.reader.elementCount;
  uVar8 = (ulong)fields.reader.elementCount;
  if (uVar8 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawCodeOrder_stack;
  }
  else {
    __s = kj::_::HeapArrayDisposer::allocate<bool>(uVar8);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = __s;
    sawCodeOrder_heap.size_ = uVar8;
  }
  memset(__s,0,uVar8);
  if ((local_268->_reader).dataSize < 0x100) {
    count = 0;
LAB_00167dc0:
    sawDiscriminantValue_heap.ptr = (bool *)0x0;
    sawDiscriminantValue_heap.size_ = 0;
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)0x0;
    __s_00 = sawDiscriminantValue_stack;
  }
  else {
    count = (size_t)*(ushort *)((long)(local_268->_reader).data + 0x1e);
    if (count < 0x21) goto LAB_00167dc0;
    __s_00 = kj::_::HeapArrayDisposer::allocate<bool>(count);
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawDiscriminantValue_heap.ptr = __s_00;
    sawDiscriminantValue_heap.size_ = count;
  }
  memset(__s_00,0,count);
  pVVar4 = local_278;
  uVar1 = (local_268->_reader).dataSize;
  if (0xff < uVar1) {
    pvVar2 = (local_268->_reader).data;
    uVar10 = *(ushort *)((long)pvVar2 + 0x1e);
    if (uVar10 != 0) {
      _kjCondition.left = uVar10;
      _kjCondition.right = 1;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = uVar10 != 1;
      if (uVar10 == 1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,int>&,char_const(&)[37]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x146,FAILED,"structNode.getDiscriminantCount() != 1",
                   "_kjCondition,\"union must have at least two members\"",&_kjCondition,
                   (char (*) [37])"union must have at least two members");
        local_278->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0016870e;
      }
      _kjCondition.right = fields.reader.elementCount;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = fields.reader.elementCount >= uVar10;
      if (fields.reader.elementCount < uVar10) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[54]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x148,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                   "_kjCondition,\"struct can\'t have more union fields than total fields\"",
                   (DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                   (char (*) [54])"struct can\'t have more union fields than total fields");
        local_278->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0016870e;
      }
      if (uVar1 < 0x120) {
        _kjCondition._0_4_ = 0x10;
      }
      else {
        _kjCondition._0_4_ = *(int *)((long)pvVar2 + 0x20) * 0x10 + 0x10;
      }
      _kjCondition.op.content.ptr = (char *)&dataSizeInBits;
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_17814a;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      if (dataSizeInBits < (uint)_kjCondition._0_4_) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&,char_const(&)[36]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x14b,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                   "_kjCondition,\"union discriminant is out-of-bounds\"",
                   (DebugComparison<unsigned_int,_unsigned_int_&> *)&_kjCondition,
                   (char (*) [36])"union discriminant is out-of-bounds");
        local_278->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        goto LAB_0016870e;
      }
    }
  }
  AVar12 = kj::Arena::allocateArray<unsigned_short>
                     (&local_278->loader->arena,(ulong)fields.reader.elementCount);
  LVar7 = fields.reader.elementCount;
  pVVar4->membersByDiscriminant = AVar12;
  discriminantPos = 0;
  nonDiscriminantPos = 0;
  if (0xff < (local_268->_reader).dataSize) {
    nonDiscriminantPos = (uint)*(ushort *)((long)(local_268->_reader).data + 0x1e);
  }
  nextOrdinal = 0;
  local_25c = 0;
  local_118.container = &fields;
  for (local_118.index = 0; pcVar5 = _kjCondition.op.content.ptr, local_118.index != LVar7;
      local_118.index = local_118.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
    ::operator*((Reader *)&f,&local_118);
    _kjContextFunc341.field = (Reader *)&f;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:341:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:341:7)>
                   *)&_kjCondition,&_kjContextFunc341);
    name.content = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&f);
    validateMemberName(local_278,name,local_25c);
    if (local_228 < 0x10) {
      if (LVar6 == 0) {
LAB_0016813d:
        _kjCondition_3 = false;
        goto LAB_00168145;
      }
      _kjCondition_3 = (bool)(*__s ^ 1);
      if (*__s != false) goto LAB_00168145;
      uVar8 = 0;
LAB_00168114:
      __s[uVar8] = true;
      if (0x5f < local_228) {
        if (*(ushort *)(local_238 + 10) == 1) {
          if (local_228 < 0x70) {
            uVar10 = 0;
          }
          else {
            uVar10 = *(ushort *)(local_238 + 0xc);
          }
          f_3.exception._0_2_ = uVar10;
          if (nextOrdinal <= uVar10) {
            nextOrdinal = 1;
            if (0x6f < local_228) {
              nextOrdinal = *(ushort *)(local_238 + 0xc) + 1;
            }
            goto LAB_00168222;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int&>&,char_const(&)[35]>
                    ((Fault *)&_kjCondition_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x160,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                     "_kjCondition,\"fields were not ordered by ordinal\"",
                     (DebugComparison<unsigned_short,_unsigned_int_&> *)&f_3,
                     (char (*) [35])"fields were not ordered by ordinal");
          local_278->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
        }
        else {
LAB_00168222:
          if (*(ushort *)(local_238 + 2) == 0) goto LAB_0016827a;
          uVar10 = ~*(ushort *)(local_238 + 2);
          local_128 = (uint)count;
          if (uVar10 < local_128) {
            _kjCondition_3 = (bool)(__s_00[uVar10] ^ 1);
            if (__s_00[uVar10] != true) {
              __s_00[uVar10] = true;
              uVar11 = discriminantPos;
              discriminantPos = discriminantPos + 1;
              goto LAB_001682cb;
            }
          }
          else {
            _kjCondition_3 = false;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[26]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x167,FAILED,
                     "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                     ,"_kjCondition,\"invalid discriminantValue\"",&_kjCondition_3,
                     (char (*) [26])"invalid discriminantValue");
          local_278->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
        }
        goto LAB_00168189;
      }
      if (0x1f < local_228) goto LAB_00168222;
LAB_0016827a:
      f_3.exception = (Exception *)&nonDiscriminantPos;
      if (fields.reader.elementCount < nonDiscriminantPos) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[39]>
                  ((Fault *)&_kjCondition_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x16d,FAILED,"nonDiscriminantPos <= fields.size()",
                   "_kjCondition,\"discriminantCount did not match fields\"",
                   (DebugComparison<unsigned_int_&,_unsigned_int> *)&f_3,
                   (char (*) [39])"discriminantCount did not match fields");
        local_278->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
        goto LAB_00168189;
      }
      uVar11 = nonDiscriminantPos;
      nonDiscriminantPos = nonDiscriminantPos + 1;
LAB_001682cb:
      (local_278->membersByDiscriminant).ptr[uVar11] = (unsigned_short)local_25c;
      if (local_228 < 0x50) {
LAB_001682fb:
        f_3 = f;
        fieldBits = 0;
        fieldIsPointer = false;
        capnp::schema::Field::Slot::Reader::getType((Reader *)&_kjCondition_3,(Reader *)&f_3);
        capnp::schema::Field::Slot::Reader::getDefaultValue(&local_a8,(Reader *)&f_3);
        validate(local_278,(Reader *)&_kjCondition_3,&local_a8,&fieldBits,&fieldIsPointer);
        iVar9 = 1;
        if (0x3f < local_228) {
          iVar9 = *(int *)(local_238 + 4) + 1;
        }
        if (dataSizeInBits < iVar9 * fieldBits) {
          _kjCondition_7 = false;
        }
        else {
          iVar9 = 1;
          if (0x3f < local_228) {
            iVar9 = *(int *)(local_238 + 4) + 1;
          }
          _kjCondition_7 = (uint)fieldIsPointer * iVar9 <= pointerCount;
          if ((uint)fieldIsPointer * iVar9 <= pointerCount) goto LAB_00168538;
        }
        local_a8._reader.segment._0_4_ = 0;
        if (0x3f < local_228) {
          local_a8._reader.segment._0_4_ = *(undefined4 *)(local_238 + 4);
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                  ((Fault *)&_kjCondition_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x17b,FAILED,
                   "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                   ,
                   "_kjCondition,\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                   ,&_kjCondition_7,(char (*) [27])"field offset out-of-bounds",(uint *)&local_a8,
                   &dataSizeInBits,&pointerCount);
        local_278->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
        goto LAB_00168189;
      }
      if (*(ushort *)(local_238 + 8) == 1) {
        if (local_228 < 0xc0) {
          id = 0;
        }
        else {
          id = *(uint64_t *)(local_238 + 0x10);
        }
        validateTypeId(local_278,id,STRUCT);
      }
      else if (*(ushort *)(local_238 + 8) == 0) goto LAB_001682fb;
LAB_00168538:
      local_25c = local_25c + 1;
      bVar3 = true;
    }
    else {
      if (LVar6 <= *(ushort *)local_238) goto LAB_0016813d;
      _kjCondition_3 = (bool)(__s[*(ushort *)local_238] ^ 1);
      if (__s[*(ushort *)local_238] == false) {
        uVar8 = (ulong)*(ushort *)local_238;
        goto LAB_00168114;
      }
LAB_00168145:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                (&f_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x15a,FAILED,
                 "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                 ,"_kjCondition,\"invalid codeOrder\"",&_kjCondition_3,
                 (char (*) [18])"invalid codeOrder");
      local_278->isValid = false;
      kj::_::Debug::Fault::~Fault(&f_3);
LAB_00168189:
      bVar3 = false;
    }
    kj::_::Debug::Context::~Context((Context *)&_kjCondition);
    if (!bVar3) goto LAB_0016870e;
  }
  uVar1 = (local_268->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(ushort *)((long)(local_268->_reader).data + 0x1e);
  }
  _kjCondition._0_8_ = &discriminantPos;
  _kjCondition.op.content.ptr = (char *)CONCAT62(_kjCondition.op.content.ptr._2_6_,uVar10);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_1f258;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (discriminantPos != uVar10) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_short>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18a,FAILED,"discriminantPos == structNode.getDiscriminantCount()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_short> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition._0_8_ = &nonDiscriminantPos;
  _kjCondition.op.content.ptr._4_4_ = SUB84(pcVar5,4);
  _kjCondition.op.content.ptr =
       (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,fields.reader.elementCount);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_1f258;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (nonDiscriminantPos != fields.reader.elementCount) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18b,FAILED,"nonDiscriminantPos == fields.size()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((0xe0 < uVar1) &&
     (pvVar2 = (local_268->_reader).data, (*(byte *)((long)pvVar2 + 0x1c) & 1) != 0)) {
    _kjCondition._0_8_ = &scopeId_local;
    _kjCondition.op.content.ptr = (char *)((ulong)_kjCondition.op.content.ptr._4_4_ << 0x20);
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_1f341;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if (scopeId_local == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[27]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18e,FAILED,"scopeId != 0","_kjCondition,\"group node missing scopeId\"",
                 (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
                 (char (*) [27])"group node missing scopeId");
      local_278->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      Impl::requireStructSize
                (local_278->loader,scopeId_local,(uint)*(ushort *)((long)pvVar2 + 0xe),
                 (uint)*(ushort *)((long)pvVar2 + 0x18));
      validateTypeId(local_278,scopeId_local,STRUCT);
    }
  }
LAB_0016870e:
  kj::Array<bool>::~Array(&sawDiscriminantValue_heap);
  kj::Array<bool>::~Array(&sawCodeOrder_heap);
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }